

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorElement.cpp
# Opt level: O0

Sensor * __thiscall
iDynTree::AccelerometerSensorHelper::generateSensor(AccelerometerSensorHelper *this,Model *model)

{
  ulong uVar1;
  AccelerometerSensor *this_00;
  element_type *peVar2;
  string *in_RSI;
  AccelerometerSensor *sensor;
  LinkIndex linkIndex;
  undefined8 local_20;
  string *local_18;
  AccelerometerSensor *local_8;
  
  local_18 = in_RSI;
  std::
  __shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b0461);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::
    __shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b0499);
    local_20 = iDynTree::Model::getLinkIndex(local_18);
    this_00 = (AccelerometerSensor *)operator_new(0x10);
    iDynTree::AccelerometerSensor::AccelerometerSensor(this_00);
    peVar2 = std::
             __shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b04ec);
    (**(code **)(*(long *)this_00 + 0x70))(this_00,&peVar2->m_origin);
    peVar2 = std::
             __shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b0515);
    (**(code **)(*(long *)this_00 + 0x28))(this_00,peVar2);
    peVar2 = std::
             __shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b053b);
    (**(code **)(*(long *)this_00 + 0x60))(this_00,&peVar2->m_attachedLink);
    (**(code **)(*(long *)this_00 + 0x68))(this_00,&local_20);
    local_8 = this_00;
  }
  else {
    local_8 = (AccelerometerSensor *)0x0;
  }
  return (Sensor *)local_8;
}

Assistant:

Sensor* AccelerometerSensorHelper::generateSensor(const Model& model) const
    {
        if (m_sensorInfo->m_attachedLink.empty()) {
            //TODO: error
            return nullptr;
        }
        iDynTree::LinkIndex linkIndex = model.getLinkIndex(m_sensorInfo->m_attachedLink);

        AccelerometerSensor * sensor = new AccelerometerSensor();
        sensor->setLinkSensorTransform(m_sensorInfo->m_origin);
        sensor->setName(m_sensorInfo->m_name);
        sensor->setParentLink(m_sensorInfo->m_attachedLink);
        sensor->setParentLinkIndex(linkIndex);
        return sensor;
    }